

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpMinus::operator()
          (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
           *__return_storage_ptr__,UnaryOpMinus *this,
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          *u,int param_2)

{
  Stride<0,_0> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_0> *this_01;
  CoeffReturnType dataPtr;
  size_type sVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *this_02;
  Scalar *dataPtr_00;
  NegativeReturnType local_d0;
  Stride<0,_0> local_a2;
  undefined1 local_a0 [8];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_69;
  undefined1 local_68 [8];
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  result;
  undefined1 local_48 [8];
  Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> um;
  int param_2_local;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  *u_local;
  UnaryOpMinus *this_local;
  
  um._28_4_ = param_2;
  this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_0> *)
            std::
            vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            ::operator[](u,0);
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_0>::operator()(this_01,0,0)
  ;
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ::size(u);
  this_00 = (Stride<0,_0> *)
            ((long)&result.
                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_48,
             dataPtr,1,sVar1 << 2,this_00);
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ::size(u);
  std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::allocator(&local_69);
  std::
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  ::vector((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            *)local_68,sVar1,&local_69);
  std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~allocator(&local_69);
  this_02 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
            std::
            vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                          *)local_68,0);
  dataPtr_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                         (this_02,0,0);
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ::size(u);
  Eigen::Stride<0,_0>::Stride(&local_a2);
  Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_a0,
             dataPtr_00,1,sVar1 << 2,&local_a2);
  Eigen::
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator-(&local_d0,
            (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)local_48);
  Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>> *)local_a0,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)&local_d0);
  std::
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  ::vector(__return_storage_ptr__,
           (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            *)local_68);
  std::
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  ::~vector((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
             *)local_68);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    if constexpr (R == 0 || C == 0) {  // NOLINT
      // result vector is empty
      return u;
    }
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {
      // matrix size is known at compile time
      const Eigen::Map<const Eigen::Matrix<S, 1, Eigen::Dynamic>> um(
          &u[0](0, 0), 1, u.size() * R * C);
      std::vector<Eigen::Matrix<S, R, C, O, MR, MC>> result(u.size());
      Eigen::Map<Eigen::Matrix<S, 1, Eigen::Dynamic>> rm(&result[0](0, 0), 1,
                                                         u.size() * R * C);
      rm = -um;
      return result;
    } else {
      // matrix size is dynamic
      std::vector<Eigen::Matrix<S, R, C, O, MR, MC>> result(u.size());
      for (int i = 0; i < u.size(); ++i) {
        result[i] = -u[i];
      }
      return result;
    }
  }